

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgridlayout.cpp
# Opt level: O0

void distributeMultiBox(QList<QLayoutStruct> *chain,int start,int end,int minSize,int sizeHint,
                       QList<int> *stretchArray,int stretch)

{
  long lVar1;
  reference pQVar2;
  const_reference piVar3;
  int *piVar4;
  const_reference pQVar5;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  int in_R8D;
  long in_FS_OFFSET;
  QLayoutStruct *data_3;
  QLayoutStruct *data_2;
  int realSize;
  int nextPos;
  QLayoutStruct *data_1;
  int pos;
  int spacing;
  QLayoutStruct *data;
  int max;
  int wh;
  int w;
  int i;
  int in_stack_000000b4;
  int in_stack_000000b8;
  int in_stack_000000bc;
  int in_stack_000000c0;
  int in_stack_000000c4;
  QList<QLayoutStruct> *in_stack_000000c8;
  qsizetype in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff94;
  int iVar6;
  int local_58;
  int local_48;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_30 = 0;
  local_34 = 0;
  local_38 = 0;
  for (local_2c = in_ESI; local_2c <= in_EDX; local_2c = local_2c + 1) {
    pQVar2 = QList<QLayoutStruct>::operator[]
                       ((QList<QLayoutStruct> *)
                        CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                        in_stack_ffffffffffffff88);
    local_30 = pQVar2->minimumSize + local_30;
    local_34 = pQVar2->sizeHint + local_34;
    local_38 = pQVar2->maximumSize + local_38;
    piVar3 = QList<int>::at((QList<int> *)
                            CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                            in_stack_ffffffffffffff88);
    if (*piVar3 == 0) {
      piVar4 = qMax<int>(&pQVar2->stretch,(int *)&stack0x00000008);
      pQVar2->stretch = *piVar4;
    }
    if (local_2c != in_EDX) {
      iVar6 = pQVar2->spacing;
      local_30 = iVar6 + local_30;
      local_34 = iVar6 + local_34;
      local_38 = iVar6 + local_38;
    }
  }
  if (local_38 < in_ECX) {
    qGeomCalc(in_stack_000000c8,in_stack_000000c4,in_stack_000000c0,in_stack_000000bc,
              in_stack_000000b8,in_stack_000000b4);
    local_48 = 0;
    for (local_2c = in_ESI; local_2c <= in_EDX; local_2c = local_2c + 1) {
      pQVar2 = QList<QLayoutStruct>::operator[]
                         ((QList<QLayoutStruct> *)
                          CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                          in_stack_ffffffffffffff88);
      iVar6 = in_ECX;
      if (local_2c != in_EDX) {
        pQVar5 = QList<QLayoutStruct>::at
                           ((QList<QLayoutStruct> *)
                            CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                            in_stack_ffffffffffffff88);
        iVar6 = pQVar5->pos;
      }
      local_58 = iVar6 - local_48;
      if (local_2c != in_EDX) {
        local_58 = local_58 - pQVar2->spacing;
      }
      if (pQVar2->minimumSize < local_58) {
        pQVar2->minimumSize = local_58;
      }
      if (pQVar2->maximumSize < pQVar2->minimumSize) {
        pQVar2->maximumSize = pQVar2->minimumSize;
      }
      in_stack_ffffffffffffff94 = iVar6;
      local_48 = iVar6;
    }
  }
  else if (local_30 < in_ECX) {
    qGeomCalc(in_stack_000000c8,in_stack_000000c4,in_stack_000000c0,in_stack_000000bc,
              in_stack_000000b8,in_stack_000000b4);
    for (local_2c = in_ESI; local_2c <= in_EDX; local_2c = local_2c + 1) {
      pQVar2 = QList<QLayoutStruct>::operator[]
                         ((QList<QLayoutStruct> *)
                          CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                          in_stack_ffffffffffffff88);
      if (pQVar2->minimumSize < pQVar2->size) {
        pQVar2->minimumSize = pQVar2->size;
      }
    }
  }
  if (local_34 < in_R8D) {
    qGeomCalc(in_stack_000000c8,in_stack_000000c4,in_stack_000000c0,in_stack_000000bc,
              in_stack_000000b8,in_stack_000000b4);
    for (local_2c = in_ESI; local_2c <= in_EDX; local_2c = local_2c + 1) {
      pQVar2 = QList<QLayoutStruct>::operator[]
                         ((QList<QLayoutStruct> *)
                          CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                          in_stack_ffffffffffffff88);
      if (pQVar2->sizeHint < pQVar2->size) {
        pQVar2->sizeHint = pQVar2->size;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void distributeMultiBox(QList<QLayoutStruct> &chain, int start, int end, int minSize,
                               int sizeHint, QList<int> &stretchArray, int stretch)
{
    int i;
    int w = 0;
    int wh = 0;
    int max = 0;

    for (i = start; i <= end; i++) {
        QLayoutStruct *data = &chain[i];
        w += data->minimumSize;
        wh += data->sizeHint;
        max += data->maximumSize;
        if (stretchArray.at(i) == 0)
            data->stretch = qMax(data->stretch, stretch);

        if (i != end) {
            int spacing = data->spacing;
            w += spacing;
            wh += spacing;
            max += spacing;
        }
    }

    if (max < minSize) { // implies w < minSize
        /*
          We must increase the maximum size of at least one of the
          items. qGeomCalc() will put the extra space in between the
          items. We must recover that extra space and put it
          somewhere. It does not really matter where, since the user
          can always specify stretch factors and avoid this code.
        */
        qGeomCalc(chain, start, end - start + 1, 0, minSize);
        int pos = 0;
        for (i = start; i <= end; i++) {
            QLayoutStruct *data = &chain[i];
            int nextPos = (i == end) ? minSize : chain.at(i + 1).pos;
            int realSize = nextPos - pos;
            if (i != end)
                realSize -= data->spacing;
            if (data->minimumSize < realSize)
                data->minimumSize = realSize;
            if (data->maximumSize < data->minimumSize)
                data->maximumSize = data->minimumSize;
            pos = nextPos;
        }
    } else if (w < minSize) {
        qGeomCalc(chain, start, end - start + 1, 0, minSize);
        for (i = start; i <= end; i++) {
            QLayoutStruct *data = &chain[i];
            if (data->minimumSize < data->size)
                data->minimumSize = data->size;
        }
    }

    if (wh < sizeHint) {
        qGeomCalc(chain, start, end - start + 1, 0, sizeHint);
        for (i = start; i <= end; i++) {
            QLayoutStruct *data = &chain[i];
            if (data->sizeHint < data->size)
                data->sizeHint = data->size;
        }
    }
}